

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__udp_try_send(uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,uint addrlen)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  msghdr local_68;
  
  if (nbufs == 0) {
    __assert_fail("nbufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x1c8,
                  "int uv__udp_try_send(uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int)"
                 );
  }
  if (handle->send_queue_count == 0) {
    uVar2 = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0);
    uVar3 = (ulong)uVar2;
    if (uVar2 != 0) goto LAB_003e5799;
    local_68.msg_control = (void *)0x0;
    local_68.msg_controllen = 0;
    local_68.msg_flags = 0;
    local_68._52_4_ = 0;
    local_68._12_4_ = 0;
    local_68.msg_namelen = addrlen;
    local_68.msg_iovlen = (size_t)nbufs;
    local_68.msg_name = addr;
    local_68.msg_iov = (iovec *)bufs;
    do {
      uVar3 = sendmsg((handle->io_watcher).fd,&local_68,0);
      if (uVar3 != 0xffffffffffffffff) goto LAB_003e5799;
      piVar4 = __errno_location();
      iVar1 = *piVar4;
    } while (iVar1 == 4);
    if ((iVar1 != 0xb) && (iVar1 != 0x69)) {
      uVar3 = (ulong)(uint)-iVar1;
      goto LAB_003e5799;
    }
  }
  uVar3 = 0xfffffffffffffff5;
LAB_003e5799:
  return (int)uVar3;
}

Assistant:

int uv__udp_try_send(uv_udp_t* handle,
                     const uv_buf_t bufs[],
                     unsigned int nbufs,
                     const struct sockaddr* addr,
                     unsigned int addrlen) {
  int err;
  struct msghdr h;
  ssize_t size;

  assert(nbufs > 0);

  /* already sending a message */
  if (handle->send_queue_count != 0)
    return UV_EAGAIN;

  err = uv__udp_maybe_deferred_bind(handle, addr->sa_family, 0);
  if (err)
    return err;

  memset(&h, 0, sizeof h);
  h.msg_name = (struct sockaddr*) addr;
  h.msg_namelen = addrlen;
  h.msg_iov = (struct iovec*) bufs;
  h.msg_iovlen = nbufs;

  do {
    size = sendmsg(handle->io_watcher.fd, &h, 0);
  } while (size == -1 && errno == EINTR);

  if (size == -1) {
    if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
      return UV_EAGAIN;
    else
      return UV__ERR(errno);
  }

  return size;
}